

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int r4k_map_address_mips
              (CPUMIPSState *env,hwaddr *physical,int *prot,target_ulong_conflict address,int rw,
              int access_type)

{
  ushort uVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (((uint)env->CP0_Config5 >> 0x11 & 1) == 0) {
    uVar2 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  }
  else {
    uVar2 = env->CP0_MemoryMapID;
  }
  uVar6 = (ulong)env->tlb->tlb_in_use;
  if (uVar6 != 0) {
    puVar3 = (env->tlb->mmu).r4k.tlb[0].PFN;
    do {
      if (((uint)env->CP0_Config5 >> 0x11 & 1) == 0) {
        uVar4 = (uint)(ushort)*(uint32_t *)(puVar3 + -2);
      }
      else {
        uVar4 = *(uint *)((long)puVar3 + -0xc);
      }
      uVar5 = *(uint *)((long)puVar3 + -0x14) | 0x1fff;
      uVar1 = (ushort)*(uint32_t *)(puVar3 + -1);
      if ((((uVar1 & 1) != 0) || (uVar4 == uVar2)) &&
         (-1 < (short)uVar1 &&
          (((uint)((r4k_tlb_t_conflict *)(puVar3 + -3))->VPN ^ address) & ~uVar5) == 0)) {
        uVar4 = uVar5 >> 1;
        uVar2 = ~uVar4 & address;
        if ((uVar2 & uVar5) == 0) {
          if (-1 < (char)uVar1) {
            return -3;
          }
        }
        else if ((uVar1 >> 8 & 1) == 0) {
          return -3;
        }
        if (rw == 0) {
          if ((uVar2 & uVar5) == 0) {
            if ((uVar1 >> 0xd & 1) != 0) {
              return -5;
            }
LAB_00755233:
            *physical = (ulong)(uVar4 & address) | *puVar3;
            *prot = 1;
LAB_00755242:
            uVar2 = *(uint *)(puVar3 + -1);
            if ((uVar2 >> 9 & 1) == 0) {
              uVar4 = 1;
            }
            else {
              *prot = 3;
              uVar2 = (uint)(ushort)*(uint32_t *)(puVar3 + -1);
              uVar4 = 3;
            }
            uVar2 = uVar2 >> 0xb;
            goto joined_r0x00755265;
          }
          if (0x3fff < uVar1) {
            return -5;
          }
LAB_007551a1:
          *physical = (ulong)(uVar4 & address) | puVar3[(uVar2 & uVar5) != 0];
          *prot = 1;
        }
        else {
          if (rw == 1) {
            if ((uVar2 & uVar5) == 0) {
              if ((uVar1 >> 9 & 1) == 0) {
                return -4;
              }
              goto LAB_00755233;
            }
            if ((uVar1 >> 10 & 1) == 0) {
              return -4;
            }
            goto LAB_007551a1;
          }
          if (rw == 2) {
            if ((uVar2 & uVar5) == 0) {
              if ((uVar1 >> 0xb & 1) != 0) {
                return -6;
              }
              goto LAB_00755233;
            }
            if ((uVar1 >> 0xc & 1) != 0) {
              return -6;
            }
            goto LAB_007551a1;
          }
          *physical = (ulong)(uVar4 & address) | puVar3[(uVar2 & uVar5) != 0];
          *prot = 1;
          if ((uVar2 & uVar5) == 0) goto LAB_00755242;
        }
        uVar2 = *(uint *)(puVar3 + -1);
        if ((uVar2 >> 10 & 1) == 0) {
          uVar4 = 1;
        }
        else {
          *prot = 3;
          uVar2 = (uint)(ushort)*(uint32_t *)(puVar3 + -1);
          uVar4 = 3;
        }
        uVar2 = uVar2 >> 0xc;
joined_r0x00755265:
        if ((uVar2 & 1) == 0) {
          *prot = uVar4 | 4;
        }
        return 0;
      }
      puVar3 = puVar3 + 5;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return -2;
}

Assistant:

int r4k_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                    target_ulong address, int rw, int access_type)
{
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;

    for (i = 0; i < env->tlb->tlb_in_use; i++) {
        r4k_tlb_t *tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        target_ulong mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        target_ulong tag = address & ~mask;
        target_ulong VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif

        /* Check ASID/MMID, virtual page number & size */
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            int n = !!(address & mask & ~(mask >> 1));
            /* Check access rights */
            if (!(n ? tlb->V1 : tlb->V0)) {
                return TLBRET_INVALID;
            }
            if (rw == MMU_INST_FETCH && (n ? tlb->XI1 : tlb->XI0)) {
                return TLBRET_XI;
            }
            if (rw == MMU_DATA_LOAD && (n ? tlb->RI1 : tlb->RI0)) {
                return TLBRET_RI;
            }
            if (rw != MMU_DATA_STORE || (n ? tlb->D1 : tlb->D0)) {
                *physical = tlb->PFN[n] | (address & (mask >> 1));
                *prot = PAGE_READ;
                if (n ? tlb->D1 : tlb->D0) {
                    *prot |= PAGE_WRITE;
                }
                if (!(n ? tlb->XI1 : tlb->XI0)) {
                    *prot |= PAGE_EXEC;
                }
                return TLBRET_MATCH;
            }
            return TLBRET_DIRTY;
        }
    }
    return TLBRET_NOMATCH;
}